

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall
nuraft::asio_service::schedule(asio_service *this,ptr<delayed_task> *task,int32 milliseconds)

{
  basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
  *this_00;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  *this_01;
  element_type *peVar1;
  _Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>
  local_60;
  function<void_(void_*)> local_48;
  
  peVar1 = (task->super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1->impl_ctx_ == (void *)0x0) {
    this_01 = (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
               *)operator_new(0x78);
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::basic_waitable_timer<asio::io_context>(this_01,&this->impl_->io_svc_,0);
    local_48.super__Function_base._M_functor._8_8_ = 0;
    local_48.super__Function_base._M_functor._M_unused._M_object = _free_timer_;
    local_48._M_invoker = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
    local_48.super__Function_base._M_manager =
         std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
    peVar1->impl_ctx_ = this_01;
    std::function<void_(void_*)>::operator=(&peVar1->impl_ctx_del_,&local_48);
    std::_Function_base::~_Function_base(&local_48.super__Function_base);
    peVar1 = (task->super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  LOCK();
  (peVar1->cancelled_)._M_base._M_i = false;
  UNLOCK();
  this_00 = (basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
             *)((task->super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->impl_ctx_;
  local_60._M_f =
       (_func_void_shared_ptr<nuraft::delayed_task>_ptr_error_code *)((long)milliseconds * 1000000);
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::expires_after((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                   *)this_00,(duration *)&local_60);
  local_60._M_f = _timer_handler_;
  std::__shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2> *)
             &local_60._M_bound_args,
             &task->super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>);
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
  ::
  async_wait<std::_Bind<void(*(std::shared_ptr<nuraft::delayed_task>,std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>&,std::error_code)>>
            (this_00,&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_60._M_bound_args.
                     super__Tuple_impl<0UL,_std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>_>
                     .super__Head_base<0UL,_std::shared_ptr<nuraft::delayed_task>,_false>.
                     _M_head_impl.
                     super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2> + 8));
  return;
}

Assistant:

void asio_service::schedule(ptr<delayed_task>& task, int32 milliseconds) {
    if (task->get_impl_context() == nilptr) {
        task->set_impl_context( new asio::steady_timer(impl_->io_svc_),
                                &_free_timer_ );
    }
    // ensure it's not in cancelled state
    task->reset();

    asio::steady_timer* timer = static_cast<asio::steady_timer*>
                                ( task->get_impl_context() );
    timer->expires_after
           ( std::chrono::duration_cast<std::chrono::nanoseconds>
             ( std::chrono::milliseconds(milliseconds) ) );
    timer->async_wait( std::bind( &_timer_handler_,
                                  task,
                                  std::placeholders::_1 ) );
}